

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O3

ion_err_t flat_file_initialize
                    (ion_flat_file_t *flat_file,ion_dictionary_id_t id,ion_key_type_t key_type,
                    ion_key_size_t key_size,ion_value_size_t value_size,
                    ion_dictionary_size_t dictionary_size)

{
  ion_err_t iVar1;
  int iVar2;
  FILE *__s;
  long lVar3;
  ion_byte_t *piVar4;
  size_t __size;
  ion_fpos_t loc;
  char filename [12];
  ion_flat_file_row_t row;
  ion_fpos_t local_58;
  undefined4 local_50;
  char local_4c [12];
  ion_flat_file_row_t local_40;
  
  (flat_file->super).key_type = key_type;
  (flat_file->super).record.key_size = key_size;
  (flat_file->super).record.value_size = value_size;
  iVar2 = dictionary_get_filename(id,"ffs",local_4c);
  if (0xb < iVar2) {
    return '\x12';
  }
  flat_file->sorted_mode = '\0';
  flat_file->num_buffered = dictionary_size + (dictionary_size == 0);
  flat_file->current_loaded_region = -1;
  __s = fopen(local_4c,"r+b");
  flat_file->data_file = (FILE *)__s;
  if (__s == (FILE *)0x0) {
    __s = fopen(local_4c,"w+b");
    flat_file->data_file = (FILE *)__s;
    if (__s == (FILE *)0x0) {
      return '\t';
    }
  }
  local_50 = 0xadde;
  fwrite(&local_50,4,1,__s);
  lVar3 = ftell((FILE *)flat_file->data_file);
  flat_file->start_of_data = lVar3;
  if (lVar3 != -1) {
    __size = (long)key_size + (long)value_size + 1;
    flat_file->row_size = __size;
    piVar4 = (ion_byte_t *)calloc((ulong)flat_file->num_buffered,__size);
    flat_file->buffer = piVar4;
    if (piVar4 == (ion_byte_t *)0x0) {
      fclose((FILE *)flat_file->data_file);
      return '\x06';
    }
    iVar2 = fseek((FILE *)flat_file->data_file,0,2);
    if (iVar2 != 0) {
      fclose((FILE *)flat_file->data_file);
      return '\r';
    }
    lVar3 = ftell((FILE *)flat_file->data_file);
    flat_file->eof_position = lVar3;
    if (lVar3 != -1) {
      local_58 = -1;
      lVar3 = 0;
      iVar1 = flat_file_scan(flat_file,-1,&local_58,&local_40,'\0',flat_file_predicate_not_empty);
      if (iVar1 != '\x0e') {
        if (iVar1 != '\0') {
          fclose((FILE *)flat_file->data_file);
          return iVar1;
        }
        lVar3 = local_58 + 1;
      }
      flat_file->eof_position = lVar3 * flat_file->row_size + flat_file->start_of_data;
      return '\0';
    }
  }
  fclose((FILE *)flat_file->data_file);
  return '\b';
}

Assistant:

ion_err_t
flat_file_initialize(
	ion_flat_file_t			*flat_file,
	ion_dictionary_id_t		id,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	ion_dictionary_size_t	dictionary_size
) {
	if (dictionary_size <= 0) {
		/* Clamp the dictionary size since we always need at least 1 row to buffer */
		dictionary_size = 1;
	}

	flat_file->super.key_type			= key_type;
	flat_file->super.record.key_size	= key_size;
	flat_file->super.record.value_size	= value_size;

	char	filename[ION_MAX_FILENAME_LENGTH];
	int		actual_filename_length = dictionary_get_filename(id, "ffs", filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_uninitialized;
	}

	flat_file->sorted_mode				= boolean_false;/* By default, we don't use sorted mode */
	flat_file->num_buffered				= dictionary_size;
	flat_file->current_loaded_region	= -1;	/* No loaded region yet */

	flat_file->data_file				= fopen(filename, "r+b");

	if (NULL == flat_file->data_file) {
		/* The file did not exist - lets open to write */
		flat_file->data_file = fopen(filename, "w+b");

		if (NULL == flat_file->data_file) {
			/* Failed to open, even to create */
			return err_file_open_error;
		}
	}

	/* For now, we don't have any header information. But we write some garbage there just so that
	   we can verify that the code to handle the header is working.*/
	fwrite(&(int) { 0xADDE }, sizeof(int), 1, flat_file->data_file);
	flat_file->start_of_data = ftell(flat_file->data_file);

	if (-1 == flat_file->start_of_data) {
		fclose(flat_file->data_file);
		return err_file_read_error;
	}

	/* A record is laid out as: | STATUS |	  KEY	 |	   VALUE	  | */
	/*				   Bytes:	(1)	 (key_size)   (value_size)	*/
	flat_file->row_size = sizeof(ion_flat_file_row_status_t) + key_size + value_size;
	flat_file->buffer	= calloc(flat_file->num_buffered, flat_file->row_size);

	if (NULL == flat_file->buffer) {
		fclose(flat_file->data_file);
		return err_out_of_memory;
	}

	if (0 != fseek(flat_file->data_file, 0, SEEK_END)) {
		fclose(flat_file->data_file);
		return err_file_bad_seek;
	}

	flat_file->eof_position = ftell(flat_file->data_file);

	if (-1 == flat_file->eof_position) {
		fclose(flat_file->data_file);
		return err_file_read_error;
	}

	/* Now move the eof to the last non-empty row in the file */
	ion_fpos_t			loc = -1;
	ion_flat_file_row_t row;
	ion_err_t			err = flat_file_scan(flat_file, -1, &loc, &row, ION_FLAT_FILE_SCAN_BACKWARDS, flat_file_predicate_not_empty);

	if ((err_ok != err) && (err_file_hit_eof != err)) {
		fclose(flat_file->data_file);
		return err;
	}

	if (err_file_hit_eof == err) {
		/* Then there are no occupied rows in the file. We'll set to the start of data. */
		loc = -1;
	}

	/* Move to its final position as one-past the position found. */
	flat_file->eof_position = flat_file->start_of_data + (loc + 1) * flat_file->row_size;

	return err_ok;
}